

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_gmsh.cpp
# Opt level: O2

ssize_t Omega_h::gmsh::read(int __fd,void *__buf,size_t __nbytes)

{
  char cVar1;
  value_type *pvVar2;
  undefined4 in_register_0000003c;
  __shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> local_230;
  ifstream file;
  
  pvVar2 = filesystem::path::c_str((path *)__buf);
  std::ifstream::ifstream(&file,pvVar2,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    std::__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_230,(__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> *)__nbytes);
    read(__fd,&file,(size_t)&local_230);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_230._M_refcount);
    std::ifstream::~ifstream(&file);
    return CONCAT44(in_register_0000003c,__fd);
  }
  pvVar2 = filesystem::path::c_str((path *)__buf);
  fail("couldn\'t open \"%s\"\n",pvVar2);
}

Assistant:

Mesh read(filesystem::path const& filename, CommPtr comm) {
  std::ifstream file(filename.c_str());
  if (!file.is_open()) {
    Omega_h_fail("couldn't open \"%s\"\n", filename.c_str());
  }
  return gmsh::read(file, comm);
}